

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O1

void __thiscall
klogic::mvn::learn(mvn *this,const_iterator Xbeg,const_iterator Xend,cmplx *error,
                  double learning_rate,bool variable_rate)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  pointer pcVar4;
  double __z;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double local_50;
  double local_48;
  complex<double> local_40;
  
  lVar2 = (long)(this->weights).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->weights).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar3 = lVar2 >> 4;
  if (lVar3 == ((long)Xend._M_current - (long)Xbeg._M_current >> 4) + 1) {
    auVar6._8_4_ = (int)(lVar2 >> 0x24);
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = 0x45300000;
    dVar7 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    dVar8 = (*(double *)error->_M_value * learning_rate) / dVar7;
    dVar7 = (learning_rate * *(double *)(error->_M_value + 8)) / dVar7;
    if (variable_rate) {
      weighted_sum(this,Xbeg,Xend);
      dVar5 = cabs(__z);
      dVar8 = dVar8 / dVar5;
      dVar7 = dVar7 / dVar5;
    }
    pcVar1 = (this->weights).
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar5 = *(double *)(pcVar1->_M_value + 8);
    *(double *)pcVar1->_M_value = *(double *)pcVar1->_M_value + dVar8;
    *(double *)(pcVar1->_M_value + 8) = dVar5 + dVar7;
    if (pcVar1 + 1 !=
        (this->weights).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar2 = 0;
      do {
        local_40._M_value._0_8_ = *(undefined8 *)((Xbeg._M_current)->_M_value + lVar2);
        local_40._M_value._8_8_ =
             *(ulong *)((Xbeg._M_current)->_M_value + lVar2 + 8) ^ 0x8000000000000000;
        local_50 = dVar8;
        local_48 = dVar7;
        std::complex<double>::operator*=((complex<double> *)&local_50,&local_40);
        pcVar4 = (pointer)((pcVar1 + 1)[1]._M_value + lVar2);
        dVar5 = *(double *)(pcVar4[-1]._M_value + 8);
        *(double *)pcVar4[-1]._M_value = local_50 + *(double *)pcVar4[-1]._M_value;
        *(double *)(pcVar4[-1]._M_value + 8) = local_48 + dVar5;
        lVar2 = lVar2 + 0x10;
      } while (pcVar4 != (this->weights).
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    return;
  }
  __assert_fail("weights.size() == Xend - Xbeg + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",
                0x28,
                "void klogic::mvn::learn(cvector::const_iterator, cvector::const_iterator, const cmplx &, double, bool)"
               );
}

Assistant:

void klogic::mvn::learn(cvector::const_iterator Xbeg,
                        cvector::const_iterator Xend,
                        const cmplx &error, double learning_rate, bool variable_rate)
{
    assert(weights.size() == Xend - Xbeg + 1);

    cmplx factor = error * learning_rate / (double)weights.size(); // division by N+1

    if (variable_rate)
        factor /= std::abs(weighted_sum(Xbeg, Xend));

    cvector::iterator       w = weights.begin();
    cvector::const_iterator x = Xbeg;

    // cout << "learn(): error=" << error << " factor=" << factor << "weights before: " << weights_vector() << endl;

    *w++ += factor;         // change bias

    for (; w != weights.end(); w++, x++) {
        *w += factor * std::conj(*x);
    }

    // cout << "learn(): weights after: " << weights_vector() << endl;

}